

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * tinyusdz::print_typed_token_attr<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>
                   (string *__return_storage_ptr__,
                   TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
                   *attr,string *name,uint32_t indent)

{
  Path *v;
  bool bVar1;
  ostream *poVar2;
  long *plVar3;
  uint32_t indent_00;
  undefined4 in_register_0000000c;
  pprint *this;
  pprint *ppVar4;
  size_type *psVar5;
  uint32_t n;
  FaceVaryingLinearInterpolation v_00;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t n_01;
  char *pcVar6;
  long lVar7;
  bool *pbVar8;
  stringstream ss;
  string local_240;
  string *local_220;
  string local_218;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  this = (pprint *)CONCAT44(in_register_0000000c,indent);
  ppVar4 = this;
  std::__cxx11::stringstream::stringstream(local_1b8);
  indent_00 = (uint32_t)ppVar4;
  bVar1 = (attr->_attrib).has_value_;
  if (attr->_empty == false) {
    lVar7 = 0x228;
    if ((((bVar1 & 1U) == 0) &&
        (lVar7 = 600,
        (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start)) && (attr->_blocked == false)) goto LAB_001636af;
  }
  else {
    lVar7 = 600;
    if ((bVar1 & 1U) != 0) {
      lVar7 = 0x228;
    }
  }
  pbVar8 = &(attr->_metas).interpolation.has_value_ + lVar7;
  bVar1 = AttrMetas::authored(&attr->_metas);
  local_220 = __return_storage_ptr__;
  if (((bVar1) || (*(char *)(pbVar8 + 4) != '\0')) ||
     ((n_01 = n,
      (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start &&
      ((attr->_empty != false || (((attr->_attrib).has_value_ & 1U) == 0)))))) {
    pprint::Indent_abi_cxx11_(&local_240,this,n);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"token ",6);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
    if (pbVar8[5] == true) {
      pcVar6 = "None";
      lVar7 = 4;
LAB_001633dd:
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar6,lVar7);
    }
    else {
      if (*(char *)(pbVar8 + 4) != '\x01') {
        pcVar6 = "[Animatable: InternalError]";
        lVar7 = 0x1b;
        goto LAB_001633dd;
      }
      to_string_abi_cxx11_(&local_1d8,(tinyusdz *)(ulong)*(uint *)pbVar8,v_00);
      local_1f8 = local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"\"","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_240,local_1f8,local_1f0 + (long)local_1f8);
      std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_1d8._M_dataplus._M_p);
      plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_1f8);
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_218.field_2._M_allocated_capacity = *psVar5;
        local_218.field_2._8_8_ = plVar3[3];
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      }
      else {
        local_218.field_2._M_allocated_capacity = *psVar5;
        local_218._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_218._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      indent_00 = (uint32_t)psVar5;
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8,local_1e8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
    }
    bVar1 = AttrMetas::authored(&attr->_metas);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (\n",3);
      print_attr_metas_abi_cxx11_
                (&local_240,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),indent_00);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
      pprint::Indent_abi_cxx11_(&local_218,(pprint *)(ulong)indent,n_00);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_218._M_dataplus._M_p,local_218._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      __return_storage_ptr__ = local_220;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        __return_storage_ptr__ = local_220;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX;
  }
  if ((char)*(uint *)(pbVar8 + 0x20) == '\x01') {
    TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::update
              ((TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation> *)(pbVar8 + 8))
    ;
    n_01 = extraout_EDX_00;
  }
  if (*(long *)(pbVar8 + 0x10) != *(long *)(pbVar8 + 8)) {
    pprint::Indent_abi_cxx11_(&local_240,this,n_01);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"token ",6);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".timeSamples = ",0xf);
    print_typed_token_timesamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>
              (&local_240,
               (TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation> *)(pbVar8 + 8),
               indent);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    __return_storage_ptr__ = local_220;
    n_01 = extraout_EDX_01;
  }
  if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pprint::Indent_abi_cxx11_(&local_240,this,n_01);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"token ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
    v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start;
    lVar7 = ((long)(attr->_paths).
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)v >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (lVar7 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
    }
    else if (lVar7 == 1) {
      std::operator<<(local_1a8,v);
    }
    else {
      std::operator<<(local_1a8,&attr->_paths);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
LAB_001636af:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_token_attr(
    const TypedAttributeWithFallback<Animatable<T>> &attr,
    const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    const auto &v = attr.get_value();

    if (attr.metas().authored() || v.has_value() || attr.is_value_empty()) {
      ss << pprint::Indent(indent);
      ss << "token " << name << " = ";
      if (v.is_blocked()) {
        ss << "None";
      } else {
        T a;
        if (v.get_scalar(&a)) {
          ss << quote(to_string(a));
        } else { 
          ss << "[Animatable: InternalError]";
        }
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (v.has_timesamples()) {

      ss << pprint::Indent(indent);
      ss << "token " << name << ".timeSamples = ";

      ss << print_typed_token_timesamples(v.get_timesamples(), indent);
      ss << "\n";
    }


    if (attr.has_connections()) {
      ss << pprint::Indent(indent);

      ss << "token " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }

  }


  return ss.str();
}